

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibUtil.c
# Opt level: O2

Mio_Library_t *
Abc_SclDeriveGenlib(void *pScl,void *pMio,float SlewInit,float Gain,int nGatesMin,int fVerbose)

{
  Vec_Str_t *p;
  Mio_Library_t *pMVar1;
  int nCellCount;
  uint local_30;
  float local_2c;
  
  local_30 = 0;
  if ((SlewInit == 0.0) && (!NAN(SlewInit))) {
    SlewInit = Abc_SclComputeAverageSlew((SC_Lib *)pScl);
  }
  local_2c = SlewInit;
  if (pMio == (void *)0x0) {
    p = Abc_SclProduceGenlibStr((SC_Lib *)pScl,SlewInit,Gain,nGatesMin,(int *)&local_30);
  }
  else {
    p = Abc_SclProduceGenlibStrProfile
                  ((SC_Lib *)pScl,(Mio_Library_t *)pMio,SlewInit,Gain,nGatesMin,(int *)&local_30);
  }
  pMVar1 = Mio_LibraryRead(*(char **)((long)pScl + 8),p->pArray,(char *)0x0,0);
  Vec_StrFree(p);
  if (pMVar1 == (Mio_Library_t *)0x0) {
    puts("Reading library has filed.");
  }
  else if (fVerbose != 0) {
    printf("Derived GENLIB library \"%s\" with %d gates using slew %.2f ps and gain %.2f.\n",
           (double)local_2c,(double)Gain,*pScl,(ulong)local_30);
  }
  return pMVar1;
}

Assistant:

Mio_Library_t * Abc_SclDeriveGenlib( void * pScl, void * pMio, float SlewInit, float Gain, int nGatesMin, int fVerbose )
{
    int nCellCount = 0;
    SC_Lib * p = (SC_Lib *)pScl;
    float Slew = (SlewInit == 0) ? Abc_SclComputeAverageSlew(p) : SlewInit;
    Vec_Str_t * vStr;
    Mio_Library_t * pLib;
    if ( pMio == NULL )
        vStr = Abc_SclProduceGenlibStr( p, Slew, Gain, nGatesMin, &nCellCount );
    else
        vStr = Abc_SclProduceGenlibStrProfile( p, (Mio_Library_t *)pMio, Slew, Gain, nGatesMin, &nCellCount );
    pLib = Mio_LibraryRead( p->pFileName, Vec_StrArray(vStr), NULL, 0 );  
    Vec_StrFree( vStr );
    if ( !pLib )
        printf( "Reading library has filed.\n" );
    else if ( fVerbose )
        printf( "Derived GENLIB library \"%s\" with %d gates using slew %.2f ps and gain %.2f.\n", p->pName, nCellCount, Slew, Gain );
    return pLib;
}